

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O2

AMQP_VALUE amqpvalue_create_released(RELEASED_HANDLE released)

{
  AMQP_VALUE pAVar1;
  
  if (released != (RELEASED_HANDLE)0x0) {
    pAVar1 = amqpvalue_clone(released->composite_value);
    return pAVar1;
  }
  return (AMQP_VALUE)0x0;
}

Assistant:

AMQP_VALUE amqpvalue_create_released(RELEASED_HANDLE released)
{
    AMQP_VALUE result;

    if (released == NULL)
    {
        result = NULL;
    }
    else
    {
        RELEASED_INSTANCE* released_instance = (RELEASED_INSTANCE*)released;
        result = amqpvalue_clone(released_instance->composite_value);
    }

    return result;
}